

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_sha2.c
# Opt level: O0

char * cmSHA512_Data(sha_byte *data,size_t len,char *digest)

{
  char *pcVar1;
  undefined1 local_f0 [8];
  SHA_CTX context;
  char *digest_local;
  size_t len_local;
  sha_byte *data_local;
  
  context._200_8_ = digest;
  digest_local = (char *)len;
  len_local = (size_t)data;
  cmSHA512_Init((SHA_CTX *)local_f0);
  cmSHA512_Update((SHA_CTX *)local_f0,(sha_byte *)len_local,(size_t)digest_local);
  pcVar1 = cmSHA512_End((SHA_CTX *)local_f0,(char *)context._200_8_);
  return pcVar1;
}

Assistant:

char* SHA512_Data(const sha_byte* data, size_t len, char digest[SHA512_DIGEST_STRING_LENGTH]) {
	SHA_CTX	context;

	SHA512_Init(&context);
	SHA512_Update(&context, data, len);
	return SHA512_End(&context, digest);
}